

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* testing::GetReservedAttributesForElement
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *xml_element)

{
  int iVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RAX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RAX_00;
  allocator_type *__a;
  undefined1 *__last;
  undefined1 *__first;
  GTestLog local_20;
  allocator_type local_1b;
  allocator_type local_1a;
  allocator_type local_19;
  
  iVar1 = std::__cxx11::string::compare((char *)xml_element);
  if (iVar1 == 0) {
    __first = kReservedTestSuitesAttributes;
    __last = kReservedTestSuiteAttributes;
    __a = &local_19;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)xml_element);
    if (iVar1 == 0) {
      __first = kReservedTestSuiteAttributes;
      __last = kReservedTestCaseAttributes;
      __a = &local_1a;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)xml_element);
      if (iVar1 != 0) {
        internal::GTestLog::GTestLog
                  (&local_20,GTEST_FATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/VBot2410[P]A_Star_3D/vendor/googletest/googletest/src/gtest.cc"
                   ,0x849);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Condition false failed. ",0x18);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unrecognized xml_element provided: ",0x23);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,(xml_element->_M_dataplus)._M_p,
                   xml_element->_M_string_length);
        internal::GTestLog::~GTestLog(&local_20);
        (__return_storage_ptr__->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        return extraout_RAX;
      }
      __first = kReservedTestCaseAttributes;
      __last = &DAT_00158a60;
      __a = &local_1b;
    }
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<char_const*const*,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,(char **)__first,(char **)__last,__a);
  return extraout_RAX_00;
}

Assistant:

static std::vector<std::string> GetReservedAttributesForElement(
    const std::string& xml_element) {
  if (xml_element == "testsuites") {
    return ArrayAsVector(kReservedTestSuitesAttributes);
  } else if (xml_element == "testsuite") {
    return ArrayAsVector(kReservedTestSuiteAttributes);
  } else if (xml_element == "testcase") {
    return ArrayAsVector(kReservedTestCaseAttributes);
  } else {
    GTEST_CHECK_(false) << "Unrecognized xml_element provided: " << xml_element;
  }
  // This code is unreachable but some compilers may not realizes that.
  return std::vector<std::string>();
}